

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

void __thiscall
duckdb::PrimitiveDictionary<int,_int,_duckdb::ParquetCastOperator>::PrimitiveDictionary
          (PrimitiveDictionary<int,_int,_duckdb::ParquetCastOperator> *this,Allocator *allocator_p,
          idx_t maximum_size_p,idx_t maximum_target_capacity_p)

{
  Allocator *pAVar1;
  primitive_dictionary_entry_t *ppVar2;
  undefined1 auVar3 [16];
  idx_t iVar4;
  uchar *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  iVar4 = duckdb::NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = iVar4;
  this->capacity_mask = iVar4 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  pAVar1 = this->allocator;
  puVar5 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar1);
  duckdb::AllocatedData::AllocatedData(&this->allocated_dictionary,pAVar1,puVar5,iVar4 * 8);
  pAVar1 = this->allocator;
  iVar4 = this->capacity;
  puVar5 = (uchar *)duckdb::Allocator::AllocateData((ulong)pAVar1);
  duckdb::AllocatedData::AllocatedData(&this->allocated_target,pAVar1,puVar5,iVar4 << 2);
  duckdb::MemoryStream::MemoryStream
            (&this->target_stream,*(uchar **)&this->field_0x50,*(ulong *)&this->field_0x58);
  iVar4 = this->capacity;
  ppVar2 = *(primitive_dictionary_entry_t **)&this->field_0x38;
  this->dictionary = ppVar2;
  this->full = false;
  auVar3 = _DAT_003b4370;
  if (iVar4 != 0) {
    lVar6 = iVar4 - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_003b4370;
    auVar10 = _DAT_003b4350;
    auVar11 = _DAT_003b4360;
    do {
      auVar12 = auVar11 ^ auVar3;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        ppVar2[uVar7].index = 0xffffffff;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        ppVar2[uVar7 + 1].index = 0xffffffff;
      }
      auVar12 = auVar10 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        ppVar2[uVar7 + 2].index = 0xffffffff;
        ppVar2[uVar7 + 3].index = 0xffffffff;
      }
      uVar7 = uVar7 + 4;
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar6 + 4;
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar6 + 4;
    } while ((iVar4 + 3 & 0xfffffffffffffffc) != uVar7);
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}